

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportScripts
          (LegacyScriptPubKeyMan *this,
          set<CScript,_std::less<CScript>,_std::allocator<CScript>_> scripts,int64_t timestamp)

{
  FillableSigningProvider *pFVar1;
  _Rb_tree_node_base *in;
  uint uVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  uint uVar10;
  long in_RDX;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  WalletBatch local_80;
  string local_70;
  CScriptID id;
  WalletDatabase *pWVar7;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar7 = (WalletDatabase *)CONCAT44(extraout_var,iVar6);
  (*pWVar7->_vptr_WalletDatabase[0xe])(&local_80,pWVar7,1);
  pFVar1 = &(this->super_LegacyDataSPKM).super_FillableSigningProvider;
  local_80.m_database = pWVar7;
  for (p_Var9 = *(_Rb_tree_node_base **)(timestamp + 0x18);
      p_Var9 != (_Rb_tree_node_base *)(timestamp + 8);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    in = p_Var9 + 1;
    CScriptID::CScriptID(&id,(CScript *)in);
    iVar6 = (*(pFVar1->super_SigningProvider)._vptr_SigningProvider[3])(pFVar1,&id);
    if ((char)iVar6 == '\0') {
      bVar5 = AddCScriptWithDB(this,&local_80,(CScript *)in);
      if (!bVar5) goto LAB_009642e9;
      if (0 < in_RDX) {
        CScriptID::CScriptID((CScriptID *)&local_70,(CScript *)in);
        pmVar8 = std::
                 map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
                 ::operator[](&(this->super_LegacyDataSPKM).m_script_metadata,(key_type *)&local_70)
        ;
        pmVar8->nCreateTime = in_RDX;
      }
    }
    else {
      uVar2 = *(uint *)((long)&p_Var9[1]._M_right + 4);
      uVar10 = uVar2 - 0x1d;
      p_Var4 = *(_Rb_tree_node_base **)(p_Var9 + 1);
      if (uVar2 < 0x1d) {
        uVar10 = uVar2;
        p_Var4 = in;
      }
      s.m_size._0_4_ = uVar10;
      s.m_data = (uchar *)p_Var4;
      s.m_size._4_4_ = 0;
      HexStr_abi_cxx11_(&local_70,s);
      ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0xe01ee1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  if (0 < in_RDX) {
    UpdateTimeFirstKey(this,in_RDX);
  }
LAB_009642e9:
  if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
      local_80.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_80.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return p_Var9 == (_Rb_tree_node_base *)(timestamp + 8);
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportScripts(const std::set<CScript> scripts, int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : scripts) {
        CScriptID id(entry);
        if (HaveCScript(id)) {
            WalletLogPrintf("Already have script %s, skipping\n", HexStr(entry));
            continue;
        }
        if (!AddCScriptWithDB(batch, entry)) {
            return false;
        }

        if (timestamp > 0) {
            m_script_metadata[CScriptID(entry)].nCreateTime = timestamp;
        }
    }
    if (timestamp > 0) {
        UpdateTimeFirstKey(timestamp);
    }

    return true;
}